

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream.c
# Opt level: O3

UINT8 Audio_Deinit(void)

{
  ADRV_LIST *__ptr;
  ADRV_LIST *pAVar1;
  ADRV_INSTANCE *pAVar2;
  UINT32 UVar3;
  ADRV_LOAD *__ptr_00;
  UINT8 UVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  UVar4 = '\x18';
  if (isInit == '\x01') {
    if (runDevCount == '\x01') {
      uVar6 = 0;
      do {
        pAVar2 = runDevices;
        if (runDevices[uVar6].ID != 0xffffffff) {
          (*(runDevices[uVar6].drvStruct)->Stop)(runDevices[uVar6].drvData);
          (*(pAVar2[uVar6].drvStruct)->Destroy)(pAVar2[uVar6].drvData);
          __ptr = pAVar2[uVar6].forwardDrvs;
          pAVar2[uVar6].forwardDrvs = (ADRV_LIST *)0x0;
          while (__ptr != (ADRV_LIST *)0x0) {
            pAVar1 = __ptr->next;
            free(__ptr);
            __ptr = pAVar1;
          }
        }
      } while ((runDevCount == '\x01') && (bVar7 = uVar6 < 0xf, uVar6 = uVar6 + 1, bVar7));
    }
    __ptr_00 = audDrvLoaded;
    if (audDrvCount != 0) {
      lVar5 = 8;
      uVar6 = 0;
      UVar3 = audDrvCount;
      do {
        if ((*(byte *)((long)__ptr_00 + lVar5 + -8) & 2) != 0) {
          (**(code **)(*(long *)(&__ptr_00->flags + lVar5) + 0x20))();
          __ptr_00 = audDrvLoaded;
          UVar3 = audDrvCount;
        }
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x10;
      } while (uVar6 < UVar3);
    }
    free(runDevices);
    UVar4 = '\0';
    runDevices = (ADRV_INSTANCE *)0x0;
    runDevCount = '\0';
    free(__ptr_00);
    audDrvLoaded = (ADRV_LOAD *)0x0;
    audDrvCount = 0;
    isInit = '\0';
  }
  return UVar4;
}

Assistant:

UINT8 Audio_Deinit(void)
{
	UINT32 curDev;
	ADRV_INSTANCE* tempAIns;
	
	if (! isInit)
		return AERR_WASDONE;
	
	for (curDev = 0; curDev < runDevCount; curDev ++)
	{
		tempAIns = &runDevices[curDev];
		if (tempAIns->ID != ADID_UNUSED)
		{
			tempAIns->drvStruct->Stop(tempAIns->drvData);
			tempAIns->drvStruct->Destroy(tempAIns->drvData);
			ADrvLst_Clear(&tempAIns->forwardDrvs);
		}
	}
	for (curDev = 0; curDev < audDrvCount; curDev ++)
	{
		if (audDrvLoaded[curDev].flags & ADFLG_IS_INIT)
			audDrvLoaded[curDev].drvStruct->Deinit();
	}
	
	free(runDevices);	runDevices = NULL;
	runDevCount = 0;
	free(audDrvLoaded);	audDrvLoaded = NULL;
	audDrvCount = 0;
	
	isInit = false;
	return AERR_OK;
}